

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ocsp_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  int iVar1;
  uint8_t local_29;
  CBS *pCStack_28;
  uint8_t status_type;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    pCStack_28 = contents;
    contents_local = (CBS *)out_alert;
    out_alert_local = (uint8_t *)hs;
    iVar1 = CBS_get_u8(contents,&local_29);
    if (iVar1 == 0) {
      hs_local._7_1_ = false;
    }
    else {
      *(uint *)(out_alert_local + 0x6c8) =
           *(uint *)(out_alert_local + 0x6c8) & 0xffffff7f | (uint)(local_29 == '\x01') << 7;
      hs_local._7_1_ = true;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ocsp_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                       CBS *contents) {
  if (contents == NULL) {
    return true;
  }

  uint8_t status_type;
  if (!CBS_get_u8(contents, &status_type)) {
    return false;
  }

  // We cannot decide whether OCSP stapling will occur yet because the correct
  // SSL_CTX might not have been selected.
  hs->ocsp_stapling_requested = status_type == TLSEXT_STATUSTYPE_ocsp;

  return true;
}